

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_handle.cpp
# Opt level: O2

void __thiscall duckdb::BufferHandle::BufferHandle(BufferHandle *this,BufferHandle *other)

{
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->node).ptr = (FileBuffer *)0x0;
  (this->node).ptr = (other->node).ptr;
  (other->node).ptr = (FileBuffer *)0x0;
  ::std::swap<duckdb::shared_ptr<duckdb::BlockHandle,true>>(&this->handle,&other->handle);
  return;
}

Assistant:

BufferHandle::BufferHandle(BufferHandle &&other) noexcept : node(nullptr) {
	std::swap(node, other.node);
	std::swap(handle, other.handle);
}